

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extensions
          (PhysicalDeviceSelector *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  pointer ppcVar1;
  pointer ppcVar2;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppcVar1 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1
      ) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar2,&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(this->criteria).required_extensions,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return this;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extensions(std::vector<const char*> const& extensions) {
    for (const auto& ext : extensions) {
        criteria.required_extensions.push_back(ext);
    }
    return *this;
}